

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int flush_data(byte_t *output_buffer,FILE *output_file_ptr)

{
  int iVar1;
  size_t sVar2;
  size_t bytesWritten;
  long num_bytes_to_write;
  FILE *output_file_ptr_local;
  byte_t *output_buffer_local;
  
  if (0 < out_bit_idx) {
    bytesWritten = bit_idx_to_byte_idx((long)out_bit_idx);
    iVar1 = get_available_bits((long)out_bit_idx);
    if (iVar1 < 8) {
      bytesWritten = bytesWritten + 1;
    }
    sVar2 = fwrite(output_buffer,1,bytesWritten,(FILE *)output_file_ptr);
    if (sVar2 != bytesWritten) {
      perror("failed to write compressed file");
      return 1;
    }
    if ((is_first_byte & 1U) != 0) {
      first_byte_written = *output_buffer;
      is_first_byte = false;
    }
  }
  return 0;
}

Assistant:

int flush_data(byte_t *output_buffer, FILE* output_file_ptr) {
    if(out_bit_idx > 0) {
        long num_bytes_to_write = bit_idx_to_byte_idx(out_bit_idx);

        if (get_available_bits(out_bit_idx) < SYMBOL_BITS)
            num_bytes_to_write++;   // reserve the space for odd bits

#ifdef _DEBUG
        log_debug("flush_data", "out_bit_idx=%-8d num_bytes_to_write=%d\n", out_bit_idx, num_bytes_to_write);

        for (int i = 0; i < num_bytes_to_write; i++)
            log_trace_char_bin(output_buffer[i]);
#endif

        size_t bytesWritten = fwrite(output_buffer, sizeof(byte_t), num_bytes_to_write, output_file_ptr);
        if (bytesWritten != num_bytes_to_write) {
            perror("failed to write compressed file");
            return RC_FAIL;
        }

        if (is_first_byte) {
            first_byte_written = output_buffer[0];
            is_first_byte = false;
        }
    }
    return RC_OK;
}